

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag.hpp
# Opt level: O0

void __thiscall
cfgfile::tag_t<cfgfile::qstring_trait_t>::tag_t
          (tag_t<cfgfile::qstring_trait_t> *this,string_t *name,bool is_mandatory)

{
  byte in_DL;
  qstring_wrapper_t *in_RDI;
  qstring_wrapper_t *in_stack_ffffffffffffffd8;
  
  (in_RDI->m_str).d.d = (Data *)&PTR__tag_t_00139870;
  qstring_wrapper_t::qstring_wrapper_t(in_RDI,in_stack_ffffffffffffffd8);
  *(byte *)&in_RDI[1].m_str.d.ptr = in_DL & 1;
  *(undefined1 *)((long)&in_RDI[1].m_str.d.ptr + 1) = 0;
  std::
  vector<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>
  ::vector((vector<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>
            *)0x125947);
  in_RDI[2].m_str.d.size = 0;
  in_RDI[3].m_str.d.d = (Data *)0xffffffffffffffff;
  in_RDI[3].m_str.d.ptr = (char16_t *)0xffffffffffffffff;
  return;
}

Assistant:

explicit tag_t( const typename Trait::string_t & name,
		bool is_mandatory = false )
		:   m_name( name )
		,   m_is_mandatory( is_mandatory )
		,   m_is_defined( false )
		,	m_parent( nullptr )
		,	m_line_number( -1 )
		,	m_column_number( -1 )
	{
	}